

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O2

int run_test_pipe_bind_error_addrnotavail(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_110;
  uv_pipe_t server;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,&server,0);
  if (iVar1 == 0) {
    iVar1 = uv_pipe_bind(&server,"/path/to/unix/socket/that/really/should/not/be/there");
    if (iVar1 == -0xd) {
      uv_close((uv_handle_t *)&server,close_cb);
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      if (close_cb_called == 1) {
        puVar2 = uv_default_loop();
        close_loop(puVar2);
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
        uStack_110 = 0x5b;
      }
      else {
        pcVar3 = "close_cb_called == 1";
        uStack_110 = 0x59;
      }
    }
    else {
      pcVar3 = "r == UV_EACCES";
      uStack_110 = 0x53;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_110 = 0x50;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-bind-error.c"
          ,uStack_110,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(pipe_bind_error_addrnotavail) {
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT(r == 0);

  r = uv_pipe_bind(&server, BAD_PIPENAME);
  ASSERT(r == UV_EACCES);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}